

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_color_hex_rgb(char *output,nk_color col)

{
  char cVar1;
  short sVar4;
  short sVar5;
  short sVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  short sVar11;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar2;
  char cVar3;
  undefined4 uVar12;
  undefined6 uVar13;
  
  auVar15._12_4_ = (uint)col >> 8;
  auVar15._8_4_ = (uint)col >> 0xc;
  auVar15._4_4_ = col;
  auVar15._0_4_ = (uint)col >> 4;
  auVar15 = auVar15 & _DAT_00159030;
  auVar14._0_4_ = -(uint)(9 < auVar15._0_4_);
  auVar14._4_4_ = -(uint)(9 < auVar15._4_4_);
  auVar14._8_4_ = -(uint)(9 < auVar15._8_4_);
  auVar14._12_4_ = -(uint)(9 < auVar15._12_4_);
  auVar16._0_4_ = auVar15._0_4_ + 0x37;
  auVar16._4_4_ = auVar15._4_4_ + 0x37;
  auVar16._8_4_ = auVar15._8_4_ + 0x37;
  auVar16._12_4_ = auVar15._12_4_ + 0x37;
  auVar14 = ~auVar14 & (_DAT_00159050 | auVar15) | auVar16 & auVar14;
  sVar4 = auVar14._0_2_;
  cVar1 = (0 < sVar4) * (sVar4 < 0x100) * auVar14[0] - (0xff < sVar4);
  sVar4 = auVar14._2_2_;
  sVar11 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar14[2] - (0xff < sVar4),cVar1);
  sVar4 = auVar14._4_2_;
  cVar9 = (0 < sVar4) * (sVar4 < 0x100) * auVar14[4] - (0xff < sVar4);
  sVar4 = auVar14._6_2_;
  uVar12 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar14[6] - (0xff < sVar4),
                    CONCAT12(cVar9,sVar11));
  sVar4 = auVar14._8_2_;
  cVar2 = (0 < sVar4) * (sVar4 < 0x100) * auVar14[8] - (0xff < sVar4);
  sVar4 = auVar14._10_2_;
  uVar13 = CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar14[10] - (0xff < sVar4),
                    CONCAT14(cVar2,uVar12));
  sVar4 = auVar14._12_2_;
  cVar3 = (0 < sVar4) * (sVar4 < 0x100) * auVar14[0xc] - (0xff < sVar4);
  sVar6 = auVar14._14_2_;
  sVar4 = (short)((uint)uVar12 >> 0x10);
  sVar5 = (short)((uint6)uVar13 >> 0x20);
  sVar6 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar14[0xe] - (0xff < sVar6),
                           CONCAT16(cVar3,uVar13)) >> 0x30);
  uVar10 = (uint)col >> 0x14 & 0xf;
  cVar7 = (char)uVar10;
  cVar8 = cVar7 + '7';
  if (uVar10 < 10) {
    cVar8 = cVar7 + '0';
  }
  *(uint *)output =
       CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                CONCAT12((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                         CONCAT11((0 < sVar4) * (sVar4 < 0x100) * cVar9 - (0xff < sVar4),
                                  (0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11))));
  output[4] = cVar8;
  uVar10 = (uint)col >> 0x10 & 0xf;
  cVar1 = (char)uVar10;
  cVar9 = cVar1 + '7';
  if (uVar10 < 10) {
    cVar9 = cVar1 + '0';
  }
  output[5] = cVar9;
  output[6] = '\0';
  return;
}

Assistant:

NK_API void
nk_color_hex_rgb(char *output, struct nk_color col)
{
    #define NK_TO_HEX(i) ((i) <= 9 ? '0' + (i): 'A' - 10 + (i))
    output[0] = (char)NK_TO_HEX((col.r & 0xF0) >> 4);
    output[1] = (char)NK_TO_HEX((col.r & 0x0F));
    output[2] = (char)NK_TO_HEX((col.g & 0xF0) >> 4);
    output[3] = (char)NK_TO_HEX((col.g & 0x0F));
    output[4] = (char)NK_TO_HEX((col.b & 0xF0) >> 4);
    output[5] = (char)NK_TO_HEX((col.b & 0x0F));
    output[6] = '\0';
    #undef NK_TO_HEX
}